

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O3

Matrix * lookat(Matrix *__return_storage_ptr__,Vec3f *eye,Vec3f *center,Vec3f *up)

{
  float fVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  long lVar3;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_58;
  
  fVar5 = eye->x - center->x;
  fVar7 = eye->y - center->y;
  fVar8 = eye->z - center->z;
  fVar10 = 1.0 / SQRT(fVar8 * fVar8 + fVar5 * fVar5 + fVar7 * fVar7);
  fVar8 = fVar8 * fVar10;
  fVar7 = fVar7 * fVar10;
  fVar10 = fVar10 * fVar5;
  fVar5 = up->y * fVar8 - fVar7 * up->z;
  fVar13 = up->z * fVar10 - fVar8 * up->x;
  fVar12 = up->x * fVar7 - fVar10 * up->y;
  fVar6 = 1.0 / SQRT(fVar12 * fVar12 + fVar5 * fVar5 + fVar13 * fVar13);
  fVar12 = fVar12 * fVar6;
  fVar13 = fVar13 * fVar6;
  fVar6 = fVar6 * fVar5;
  fVar5 = fVar7 * fVar12 - fVar13 * fVar8;
  fVar9 = fVar8 * fVar6 - fVar12 * fVar10;
  fVar11 = fVar10 * fVar13 - fVar6 * fVar7;
  Matrix::identity(__return_storage_ptr__,4);
  lVar4 = 0;
  do {
    local_58 = fVar6;
    if ((lVar4 != 0) && (local_58 = fVar13, lVar4 != 1)) {
      local_58 = fVar12;
    }
    pvVar2 = Matrix::operator[](__return_storage_ptr__,0);
    (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = local_58;
    local_58 = fVar5;
    if ((lVar4 != 0) && (local_58 = fVar9, lVar4 != 1)) {
      local_58 = fVar11;
    }
    pvVar2 = Matrix::operator[](__return_storage_ptr__,1);
    (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = local_58 * (1.0 / SQRT(fVar11 * fVar11 + fVar5 * fVar5 + fVar9 * fVar9));
    local_58 = fVar10;
    if ((lVar4 != 0) && (local_58 = fVar7, lVar4 != 1)) {
      local_58 = fVar8;
    }
    pvVar2 = Matrix::operator[](__return_storage_ptr__,2);
    (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = local_58;
    lVar3 = (ulong)(lVar4 != 1) * 4 + 4;
    if (lVar4 == 0) {
      lVar3 = 0;
    }
    fVar1 = *(float *)((long)&center->x + lVar3);
    pvVar2 = Matrix::operator[](__return_storage_ptr__,(int)lVar4);
    (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[3] = -fVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix lookat(Vec3f eye, Vec3f center, Vec3f up) {
    Vec3f z = (eye-center).normalize();
    Vec3f x = (up^z).normalize();
    Vec3f y = (z^x).normalize();
    Matrix ret = Matrix::identity(4);
    for (int i=0; i<3; i++) {
        ret[0][i] = x[i];
        ret[1][i] = y[i];
        ret[2][i] = z[i];
        ret[i][3] = -center[i];
    }
    return ret;
}